

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O1

Raster * rw::Raster::convertTexToCurrentPlatform(Raster *ras)

{
  uint uVar1;
  int iVar2;
  Image *pIVar3;
  Raster *pRVar4;
  int iVar5;
  int32 depth;
  int32 format;
  int32 height;
  int32 width;
  int32 local_40;
  uint local_3c;
  int32 local_38;
  int32 local_34;
  
  uVar1 = ras->platform;
  if (uVar1 == platform) {
    return ras;
  }
  if (platform == 9 && uVar1 == 8) {
    return ras;
  }
  if (platform == 8 && (uVar1 ^ 9) == 0) {
    return ras;
  }
  if (uVar1 == 8) {
    if (platform != 0xc) {
LAB_00110d14:
      if (((platform & 0xfffffffe) == 8 && uVar1 == 5) &&
         (pRVar4 = xbox_to_d3d(ras), pRVar4 != (Raster *)0x0)) goto LAB_00110ea4;
    }
  }
  else if ((uVar1 ^ 9) != 0 || platform != 0xc) goto LAB_00110d14;
  pIVar3 = (Image *)(**(code **)(*(long *)(engine + 0x20 + (long)ras->platform * 8) + 0x50))(ras);
  Image::unpalettize(pIVar3,false);
  (**(code **)(*(long *)(engine + 0x20 + (long)(int)platform * 8) + 0x40))
            (pIVar3,4,&local_34,&local_38,&local_40,&local_3c);
  local_3c = ras->format & 0x9000U | local_3c;
  pRVar4 = create(local_34,local_38,local_40,local_3c,0);
  (**(code **)(*(long *)(engine + 0x20 + (long)(int)platform * 8) + 0x48))(pRVar4,pIVar3);
  Image::destroy(pIVar3);
  iVar2 = (**(code **)(*(long *)(engine + 0x20 + (long)ras->platform * 8) + 0x38))(ras);
  if (1 < iVar2) {
    iVar5 = 1;
    do {
      (**(code **)(*(long *)(engine + 0x20 + (long)ras->platform * 8) + 0x18))(ras,iVar5,2);
      pIVar3 = (Image *)(**(code **)(*(long *)(engine + 0x20 + (long)ras->platform * 8) + 0x50))
                                  (ras);
      Image::unpalettize(pIVar3,false);
      (**(code **)(*(long *)(engine + 0x20 + (long)pRVar4->platform * 8) + 0x18))(pRVar4,iVar5,5);
      (**(code **)(*(long *)(engine + 0x20 + (long)(int)platform * 8) + 0x48))(pRVar4,pIVar3);
      (**(code **)(*(long *)(engine + 0x20 + (long)pRVar4->platform * 8) + 0x20))(pRVar4,iVar5);
      (**(code **)(*(long *)(engine + 0x20 + (long)ras->platform * 8) + 0x20))(ras,iVar5);
      iVar5 = iVar5 + 1;
    } while (iVar2 != iVar5);
  }
LAB_00110ea4:
  PluginList::destruct((PluginList *)&s_plglist,ras);
  (*DAT_00149de0)(ras);
  numAllocated = numAllocated + -1;
  return pRVar4;
}

Assistant:

rw::Raster*
Raster::convertTexToCurrentPlatform(rw::Raster *ras)
{
	using namespace rw;

	if(ras->platform == rw::platform)
		return ras;
	// compatible platforms
	if((ras->platform == PLATFORM_D3D8 && rw::platform == PLATFORM_D3D9) ||
	   (ras->platform == PLATFORM_D3D9 && rw::platform == PLATFORM_D3D8))
		return ras;

	// special cased conversion for DXT
	if((ras->platform == PLATFORM_D3D8 || ras->platform == PLATFORM_D3D9) && rw::platform == PLATFORM_GL3){
		Raster *newras = d3d_to_gl3(ras);
		if(newras){
			ras->destroy();
			return newras;
		}
	}else if(ras->platform == PLATFORM_XBOX && (rw::platform == PLATFORM_D3D9 || rw::platform == PLATFORM_D3D8)){
		Raster *newras = xbox_to_d3d(ras);
		if(newras){
			ras->destroy();
			return newras;
		}
	}else if(ras->platform == PLATFORM_XBOX && rw::platform == PLATFORM_GL3){
		Raster *newras = xbox_to_gl3(ras);
		if(newras){
			ras->destroy();
			return newras;
		}
	}

	// fall back to going through Image directly
	int32 width, height, depth, format;
	Image *img = ras->toImage();
	// TODO: maybe don't *always* do this?
	img->unpalettize();
	Raster::imageFindRasterFormat(img, Raster::TEXTURE, &width, &height, &depth, &format);
	format |= ras->format & (Raster::MIPMAP | Raster::AUTOMIPMAP);
	Raster *newras = Raster::create(width, height, depth, format);
	newras->setFromImage(img);
	img->destroy();
	int numLevels = ras->getNumLevels();
	for(int i = 1; i < numLevels; i++){
		ras->lock(i, Raster::LOCKREAD);
		img = ras->toImage();
		// TODO: maybe don't *always* do this?
		img->unpalettize();
		newras->lock(i, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
		newras->setFromImage(img);
		newras->unlock(i);
		ras->unlock(i);
	}
	ras->destroy();
	ras = newras;
	return ras;
}